

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear_hash.c
# Opt level: O0

int key_bytes_to_int(ion_byte_t *key,linear_hash_table_t *linear_hash)

{
  int local_20;
  int local_1c;
  int key_bytes_as_int;
  int i;
  linear_hash_table_t *linear_hash_local;
  ion_byte_t *key_local;
  
  local_20 = 0;
  for (local_1c = 0; local_1c < (linear_hash->super).record.key_size + -1; local_1c = local_1c + 1)
  {
    local_20 = ((uint)key[local_1c] * key_bytes_to_int::coefficients[local_1c + 1] -
               (uint)key[local_1c] * key_bytes_to_int::coefficients[local_1c]) + local_20;
  }
  return local_20;
}

Assistant:

int
key_bytes_to_int(
	ion_byte_t			*key,
	linear_hash_table_t *linear_hash
) {
	int			i;
	int			key_bytes_as_int	= 0;
	static int	coefficients[]		= { 3, 5, 7, 11, 13, 17, 19 };

	for (i = 0; i < linear_hash->super.record.key_size - 1; i++) {
		key_bytes_as_int += *(key + i) * coefficients[i + 1] - *(key + i) * coefficients[i];
	}

	return key_bytes_as_int;
}